

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall AGSSock::AGSSocket::Unserialize(AGSSocket *this)

{
  int in_ECX;
  char *in_RDX;
  int in_ESI;
  
  Unserialize((AGSSocket *)&this[-1].super_IAGSManagedObjectReader,in_ESI,in_RDX,in_ECX);
  return;
}

Assistant:

void AGSSocket::Unserialize(int key, const char *buffer, int length)
{
	AGSSocketSerial serial;
	int size = MIN(length, sizeof (AGSSocketSerial));
	memcpy(&serial, buffer, size);

	string tag;
	if (length - size > 0)
		tag = string(buffer + size, (size_t) length - size);
	
	Socket *sock = new Socket
	{
		INVALID_SOCKET,
		serial.domain, serial.type, serial.protocol,
		serial.error,
		AGS_FROM_KEY(SockAddr, serial.local),
		AGS_FROM_KEY(SockAddr, serial.remote),
		tag
	};
	
	AGS_RESTORE(Socket, sock, key);
}